

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_integer_points_kd_tree_decoder.h
# Opt level: O3

bool __thiscall
draco::DynamicIntegerPointsKdTreeDecoder<2>::
DecodePoints<draco::PointAttributeVectorOutputIterator<unsigned_int>>
          (DynamicIntegerPointsKdTreeDecoder<2> *this,DecoderBuffer *buffer,
          PointAttributeVectorOutputIterator<unsigned_int> *oit,uint32_t oit_max_points)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  bool bVar4;
  
  if (buffer->pos_ + 4 <= buffer->data_size_) {
    this->bit_length_ = *(uint32_t *)(buffer->data_ + buffer->pos_);
    lVar3 = buffer->pos_;
    lVar1 = lVar3 + 4;
    buffer->pos_ = lVar1;
    if ((this->bit_length_ < 0x21) && (lVar3 + 8 <= buffer->data_size_)) {
      uVar2 = *(uint *)(buffer->data_ + lVar1);
      this->num_points_ = uVar2;
      buffer->pos_ = buffer->pos_ + 4;
      if (uVar2 == 0) {
        return true;
      }
      if (uVar2 <= oit_max_points) {
        this->num_decoded_points_ = 0;
        bVar4 = RAnsBitDecoder::StartDecoding(&this->numbers_decoder_,buffer);
        if ((((bVar4) &&
             (bVar4 = DirectBitDecoder::StartDecoding(&this->remaining_bits_decoder_,buffer), bVar4)
             ) && (bVar4 = DirectBitDecoder::StartDecoding(&this->axis_decoder_,buffer), bVar4)) &&
           (bVar4 = DirectBitDecoder::StartDecoding(&this->half_decoder_,buffer), bVar4)) {
          bVar4 = DecodeInternal<draco::PointAttributeVectorOutputIterator<unsigned_int>>
                            (this,this->num_points_,oit);
          return bVar4;
        }
      }
    }
  }
  return false;
}

Assistant:

bool DynamicIntegerPointsKdTreeDecoder<compression_level_t>::DecodePoints(
    DecoderBuffer *buffer, OutputIteratorT &oit, uint32_t oit_max_points) {
  if (!buffer->Decode(&bit_length_)) {
    return false;
  }
  if (bit_length_ > 32) {
    return false;
  }
  if (!buffer->Decode(&num_points_)) {
    return false;
  }
  if (num_points_ == 0) {
    return true;
  }
  if (num_points_ > oit_max_points) {
    return false;
  }
  num_decoded_points_ = 0;

  if (!numbers_decoder_.StartDecoding(buffer)) {
    return false;
  }
  if (!remaining_bits_decoder_.StartDecoding(buffer)) {
    return false;
  }
  if (!axis_decoder_.StartDecoding(buffer)) {
    return false;
  }
  if (!half_decoder_.StartDecoding(buffer)) {
    return false;
  }

  if (!DecodeInternal(num_points_, oit)) {
    return false;
  }

  numbers_decoder_.EndDecoding();
  remaining_bits_decoder_.EndDecoding();
  axis_decoder_.EndDecoding();
  half_decoder_.EndDecoding();

  return true;
}